

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

bool __thiscall GenericAssemblerFile::seekVirtual(GenericAssemblerFile *this,u64 virtualAddress)

{
  size_t sVar1;
  uint uVar2;
  u64 physicalAddress;
  u64 virtualAddress_local;
  GenericAssemblerFile *this_local;
  
  if (virtualAddress < this->headerSize) {
    Logger::queueError<>(Error,L"Seeking to invalid address");
    this_local._7_1_ = false;
  }
  else {
    this->virtualAddress = virtualAddress;
    sVar1 = this->headerSize;
    uVar2 = (*(this->super_AssemblerFile)._vptr_AssemblerFile[2])();
    if ((uVar2 & 1) != 0) {
      BinaryFile::setPos(&this->handle,virtualAddress - sVar1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GenericAssemblerFile::seekVirtual(u64 virtualAddress)
{
	if (virtualAddress < headerSize)
	{
		Logger::queueError(Logger::Error,L"Seeking to invalid address");
		return false;
	}

	this->virtualAddress = virtualAddress;
	u64 physicalAddress = virtualAddress-headerSize;

	if (isOpen())
		handle.setPos((long)physicalAddress);

	return true;
}